

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

fy_node * fy_node_sequence_get_by_index(fy_node *fyn,int index)

{
  fy_node *pfVar1;
  int iVar2;
  void *iterp;
  void *local_28;
  
  local_28 = (void *)0x0;
  if ((fyn == (fy_node *)0x0) || ((fyn->field_0x34 & 3) != 1)) {
    pfVar1 = (fy_node *)0x0;
  }
  else if (index < 0) {
    do {
      pfVar1 = fy_node_sequence_reverse_iterate(fyn,&local_28);
      if (pfVar1 == (fy_node *)0x0) {
        return (fy_node *)0x0;
      }
      index = index + 1;
    } while (index != 0);
  }
  else {
    iVar2 = index + 1;
    do {
      pfVar1 = fy_node_sequence_iterate(fyn,&local_28);
      if (pfVar1 == (fy_node *)0x0) {
        return (fy_node *)0x0;
      }
      iVar2 = iVar2 + -1;
    } while (0 < iVar2);
  }
  return pfVar1;
}

Assistant:

struct fy_node *fy_node_sequence_get_by_index(struct fy_node *fyn, int index) {
    struct fy_node *fyni;
    void *iterp = NULL;

    if (!fyn || fyn->type != FYNT_SEQUENCE)
        return NULL;

    if (index >= 0) {
        do {
            fyni = fy_node_sequence_iterate(fyn, &iterp);
        } while (fyni && --index >= 0);
    } else {
        do {
            fyni = fy_node_sequence_reverse_iterate(fyn, &iterp);
        } while (fyni && ++index < 0);
    }

    return fyni;
}